

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

void llb_build_key_destroy(llb_build_key_t *key)

{
  if (key != (llb_build_key_t *)0x0) {
    std::__cxx11::string::_M_dispose();
  }
  operator_delete(key,0x38);
  return;
}

Assistant:

void llb_build_key_destroy(llb_build_key_t *key) {
  delete (CAPIBuildKey *)key;
}